

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_teleport(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  ROOM_INDEX_DATA *pRVar3;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  undefined4 in_R8D;
  __type_conflict2 _Var4;
  CHAR_DATA *unaff_retaddr;
  long nocrash;
  ROOM_INDEX_DATA *pRoomIndex;
  CHAR_DATA *victim;
  char *in_stack_00005c00;
  CHAR_DATA *in_stack_00005c08;
  CHAR_DATA *in_stack_ffffffffffffffa8;
  CHAR_DATA *in_stack_ffffffffffffffb0;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  CHAR_DATA *in_stack_ffffffffffffffc0;
  long local_38;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_RCX->in_room != (ROOM_INDEX_DATA *)0x0) {
    bVar1 = is_npc(in_stack_ffffffffffffffa8);
    if (!bVar1) {
      in_stack_ffffffffffffffc0 = (CHAR_DATA *)in_RCX->in_room->room_flags[0];
      _Var4 = std::pow<int,int>(0,0x61b8fd);
      if (((ulong)in_stack_ffffffffffffffc0 & (long)_Var4) != 0) goto LAB_0061b9b0;
    }
    if (in_RCX != in_RDX) {
      in_stack_ffffffffffffffb8 = (CHAR_DATA *)in_RCX->imm_flags[0];
      _Var4 = std::pow<int,int>(0,0x61b93d);
      if (((ulong)in_stack_ffffffffffffffb8 & (long)_Var4) != 0) goto LAB_0061b9b0;
    }
    if ((((in_RCX == in_RDX) || (bVar1 = is_immortal(in_stack_ffffffffffffffa8), bVar1)) &&
        (in_RCX->in_room->area->area_type != 5)) &&
       ((bVar1 = is_affected_room(in_RDX->in_room,(int)gsn_plasma_cube), !bVar1 ||
        (iVar2 = number_percent(), 0x31 < iVar2)))) {
      bVar1 = is_affected(in_RCX,(int)gsn_bind_feet);
      if (bVar1) {
        send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        return;
      }
      for (local_38 = 1; local_38 < 10000; local_38 = local_38 + 1) {
        pRVar3 = get_random_room((CHAR_DATA *)CONCAT44(in_EDI,in_ESI));
        if (pRVar3 != (ROOM_INDEX_DATA *)0x0) {
          in_stack_ffffffffffffffb0 = (CHAR_DATA *)pRVar3->room_flags[0];
          _Var4 = std::pow<int,int>(0,0x61ba4a);
          if (((ulong)in_stack_ffffffffffffffb0 & (long)_Var4) == 0) {
            in_stack_ffffffffffffffa8 = (CHAR_DATA *)pRVar3->room_flags[0];
            _Var4 = std::pow<int,int>(0,0x61ba80);
            if ((((((ulong)in_stack_ffffffffffffffa8 & (long)_Var4) == 0) &&
                 (bVar1 = is_explore((ROOM_INDEX_DATA *)in_stack_ffffffffffffffb8), !bVar1)) &&
                ((pRVar3->cabal == 0 &&
                 ((pRVar3->area->area_type != 5 && (pRVar3->area->area_type != 6)))))) &&
               ((bVar1 = is_adjacent_area(in_RDX->in_room->area,pRVar3->area), bVar1 ||
                (in_RDX->in_room->area == pRVar3->area)))) break;
          }
        }
      }
      if (in_RCX != in_RDX) {
        send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      un_watermeld(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
      act((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
          in_stack_ffffffffffffffa8,0);
      char_from_room(unaff_retaddr);
      char_to_room((CHAR_DATA *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),(ROOM_INDEX_DATA *)in_RCX
                  );
      act((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
          in_stack_ffffffffffffffa8,0);
      iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      un_blade_barrier(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
      un_watermeld(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
      do_look(in_stack_00005c08,in_stack_00005c00);
      check_plasma_thread(in_stack_ffffffffffffffc0,iVar2);
      return;
    }
  }
LAB_0061b9b0:
  send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void spell_teleport(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	ROOM_INDEX_DATA *pRoomIndex;
	long nocrash; /* Infinite loops = bad mojo */

	if (victim->in_room == nullptr
		|| (!is_npc(ch) && IS_SET(victim->in_room->room_flags, ROOM_NO_RECALL))
		|| (victim != ch && IS_SET(victim->imm_flags, IMM_SUMMON))
		|| (victim != ch && !is_immortal(ch))
		|| (victim->in_room->area->area_type == ARE_UNOPENED)
		|| (is_affected_room(ch->in_room, gsn_plasma_cube) && number_percent() < 50))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_bind_feet))
	{
		send_to_char("Your feet are rooted to the ground!\n\r", victim);
		return;
	}

	for (nocrash = 1; nocrash < 10000; nocrash++)
	{
		pRoomIndex = get_random_room(victim);
		if(pRoomIndex == nullptr)
		{
			continue; // this prevents us from evaluating rooms that don't exist due to our
			// lovely method of getting a "random" room.
		}
		if (!IS_SET(pRoomIndex->room_flags, ROOM_NO_RECALL)
			&& !IS_SET(pRoomIndex->room_flags, ROOM_NO_GATE)
			&& !is_explore(pRoomIndex)
			&& !pRoomIndex->cabal
			&& pRoomIndex->area->area_type != ARE_UNOPENED
			&& pRoomIndex->area->area_type != ARE_SHRINE
			&& (is_adjacent_area(ch->in_room->area, pRoomIndex->area) || (ch->in_room->area == pRoomIndex->area)))
		{
			break;
		}
	}

	/*
	 * If there's no valid place to tele to, they stay put.  Better than
	 * an infinite loop -- El
	 */
	if (nocrash >= 1000000)
		pRoomIndex = victim->in_room;

	if (victim != ch)
		send_to_char("You have been teleported!\n\r", victim);

	un_watermeld(victim, nullptr);

	act("$n vanishes!", victim, nullptr, nullptr, TO_ROOM);

	char_from_room(victim);
	char_to_room(victim, pRoomIndex);

	act("$n slowly fades into existence.", victim, nullptr, nullptr, TO_ROOM);

	un_blade_barrier(ch, nullptr);
	un_watermeld(ch, nullptr);

	do_look(victim, "auto");
	check_plasma_thread(victim, -1);
}